

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_msg_header_trim_u32(nng_msg *msg,uint32_t *val)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  size_t sVar4;
  
  puVar3 = (uint *)nni_msg_header(msg);
  sVar4 = nni_msg_header_len(msg);
  iVar2 = 3;
  if (3 < sVar4) {
    uVar1 = *puVar3;
    *val = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    nni_msg_header_trim(msg,4);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_header_trim_u32(nng_msg *msg, uint32_t *val)
{
	uint8_t *header = nni_msg_header(msg);
	uint32_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	NNI_GET32(header, v);
	*val = v;
	nni_msg_header_trim(msg, sizeof(v));
	return (0);
}